

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udpbitdht.cc
# Opt level: O2

void __thiscall UdpBitDht::run(UdpBitDht *this)

{
  run((UdpBitDht *)&this[-1].isAlive);
  return;
}

Assistant:

void UdpBitDht::run() {
	while(isAlive) {
		while(tick())
			usleep(TICK_PAUSE_USEC);
		{
			bdStackMutex stack(dhtMtx); /********** MUTEX LOCKED *************/
			mBitDhtManager->iteration();
		}
		sleep(1);
	}
}